

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IpxWrapper.cpp
# Opt level: O0

bool ipxStatusError(bool status_error,HighsOptions *options,string *message,int value)

{
  undefined8 uVar1;
  uint in_ECX;
  long in_RSI;
  byte in_DIL;
  
  if ((bool)(in_DIL & 1) != false) {
    if ((int)in_ECX < 0) {
      uVar1 = std::__cxx11::string::c_str();
      highsLogUser((HighsLogOptions *)(in_RSI + 0x380),kError,"Ipx: %s\n",uVar1);
    }
    else {
      uVar1 = std::__cxx11::string::c_str();
      highsLogUser((HighsLogOptions *)(in_RSI + 0x380),kError,"Ipx: %s %d\n",uVar1,(ulong)in_ECX);
    }
    fflush((FILE *)0x0);
  }
  return (bool)(in_DIL & 1);
}

Assistant:

bool ipxStatusError(const bool status_error, const HighsOptions& options,
                    std::string message, const int value) {
  if (status_error) {
    if (value < 0) {
      highsLogUser(options.log_options, HighsLogType::kError, "Ipx: %s\n",
                   message.c_str());
    } else {
      highsLogUser(options.log_options, HighsLogType::kError, "Ipx: %s %d\n",
                   message.c_str(), value);
    }
    fflush(NULL);
  }
  assert(!status_error);
  return status_error;
}